

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

void __thiscall dg::llvmdg::legacy::Block::dumpEdges(Block *this,ostream *ostream)

{
  Function *pFVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  Block *pBVar4;
  Block *this_00;
  Block *this_01;
  int __status;
  char *pcVar5;
  string local_70;
  string local_50;
  
  pcVar5 = (char *)ostream;
  for (p_Var3 = (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->successors_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pBVar4 = *(Block **)(p_Var3 + 1);
    dotName_abi_cxx11_(&local_50,this);
    poVar2 = std::operator<<(ostream,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," -> ");
    dotName_abi_cxx11_(&local_70,pBVar4);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    pcVar5 = "\n";
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  for (p_Var3 = (this->callees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->callees_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pFVar1 = (Function *)p_Var3[1]._M_parent;
    dotName_abi_cxx11_(&local_50,this);
    poVar2 = std::operator<<(ostream,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," -> ");
    pBVar4 = Function::entry(pFVar1);
    dotName_abi_cxx11_(&local_70,pBVar4);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    __status = 0x164063;
    std::operator<<(poVar2," [style=dashed, constraint=false]\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    Function::exit(pFVar1,__status);
    dotName_abi_cxx11_(&local_50,this_00);
    poVar2 = std::operator<<(ostream,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," -> ");
    dotName_abi_cxx11_(&local_70,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    pcVar5 = " [style=dashed, constraint=false]\n";
    std::operator<<(poVar2," [style=dashed, constraint=false]\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  for (p_Var3 = (this->forks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->forks_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pFVar1 = (Function *)p_Var3[1]._M_parent;
    dotName_abi_cxx11_(&local_50,this);
    poVar2 = std::operator<<(ostream,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," -> ");
    pBVar4 = Function::entry(pFVar1);
    dotName_abi_cxx11_(&local_70,pBVar4);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    pcVar5 = " [style=dotted, constraint=false]\n";
    std::operator<<(poVar2," [style=dotted, constraint=false]\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  for (p_Var3 = (this->joins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->joins_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    Function::exit((Function *)p_Var3[1]._M_parent,(int)pcVar5);
    dotName_abi_cxx11_(&local_50,this_01);
    poVar2 = std::operator<<(ostream,(string *)&local_50);
    poVar2 = std::operator<<(poVar2," -> ");
    dotName_abi_cxx11_(&local_70,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    pcVar5 = " [style=dotted, constraint=false]\n";
    std::operator<<(poVar2," [style=dotted, constraint=false]\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void Block::dumpEdges(std::ostream &ostream) const {
    for (auto *successor : successors_) {
        ostream << this->dotName() << " -> " << successor->dotName() << "\n";
    }

    for (auto callee : callees_) {
        ostream << this->dotName() << " -> "
                << callee.second->entry()->dotName()
                << " [style=dashed, constraint=false]\n";
        ostream << callee.second->exit()->dotName() << " -> " << this->dotName()
                << " [style=dashed, constraint=false]\n";
    }

    for (auto fork : forks_) {
        ostream << this->dotName() << " -> " << fork.second->entry()->dotName()
                << " [style=dotted, constraint=false]\n";
    }

    for (auto join : joins_) {
        ostream << join.second->exit()->dotName() << " -> " << this->dotName()
                << " [style=dotted, constraint=false]\n";
    }
}